

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall
testing::anon_unknown_18::MockObjectRegistry::~MockObjectRegistry(MockObjectRegistry *this)

{
  bool bVar1;
  pointer ppVar2;
  ostream *poVar3;
  char *pcVar4;
  int unaff_retaddr;
  char *in_stack_00000008;
  MockObjectState *state;
  const_iterator it;
  int leaked_count;
  map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
  *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  string local_58 [32];
  MockObjectState *local_38;
  iterator local_30;
  _Rb_tree_const_iterator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>
  local_28;
  iterator local_20;
  _Rb_tree_const_iterator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>
  local_18;
  int local_10;
  undefined4 local_c;
  
  if ((FLAGS_gmock_catch_leaked_mocks & 1) == 0) {
    local_c = 1;
  }
  else {
    local_10 = 0;
    local_20._M_node =
         (_Base_ptr)
         std::
         map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
         ::begin(in_stack_ffffffffffffff48);
    std::
    _Rb_tree_const_iterator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>
    ::_Rb_tree_const_iterator(&local_18,&local_20);
    while( true ) {
      local_30._M_node =
           (_Base_ptr)
           std::
           map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
           ::end(in_stack_ffffffffffffff48);
      std::
      _Rb_tree_const_iterator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>
      ::_Rb_tree_const_iterator(&local_28,&local_30);
      bVar1 = std::operator!=(&local_18,&local_28);
      if (!bVar1) break;
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>
                             *)in_stack_ffffffffffffff50);
      if (((ppVar2->second).leakable & 1U) == 0) {
        std::operator<<((ostream *)&std::cout,"\n");
        ppVar2 = std::
                 _Rb_tree_const_iterator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>
                 ::operator->((_Rb_tree_const_iterator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>
                               *)in_stack_ffffffffffffff50);
        local_38 = &ppVar2->second;
        internal::FormatFileLocation_abi_cxx11_(in_stack_00000008,unaff_retaddr);
        std::operator<<((ostream *)&std::cout,local_58);
        std::__cxx11::string::~string(local_58);
        std::operator<<((ostream *)&std::cout," ERROR: this mock object");
        bVar1 = std::operator!=(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
        if (bVar1) {
          poVar3 = std::operator<<((ostream *)&std::cout," (used in test ");
          poVar3 = std::operator<<(poVar3,(string *)&local_38->first_used_test_case);
          poVar3 = std::operator<<(poVar3,".");
          poVar3 = std::operator<<(poVar3,(string *)&local_38->first_used_test);
          std::operator<<(poVar3,")");
        }
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 " should be deleted but never is. Its address is @");
        ppVar2 = std::
                 _Rb_tree_const_iterator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>
                 ::operator->((_Rb_tree_const_iterator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>
                               *)in_stack_ffffffffffffff50);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,ppVar2->first);
        std::operator<<(poVar3,".");
        local_10 = local_10 + 1;
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>
                    *)in_stack_ffffffffffffff50);
    }
    if (0 < local_10) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\nERROR: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_10);
      poVar3 = std::operator<<(poVar3," leaked mock ");
      pcVar4 = "objects";
      if (local_10 == 1) {
        pcVar4 = "object";
      }
      poVar3 = std::operator<<(poVar3,pcVar4);
      std::operator<<(poVar3," found at program exit.\n");
      std::ostream::flush();
      std::ostream::flush();
      _exit(1);
    }
    local_c = 0;
  }
  std::
  map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
  ::~map((map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
          *)0x170f0e);
  return;
}

Assistant:

~MockObjectRegistry() {
    // "using ::std::cout;" doesn't work with Symbian's STLport, where cout is
    // a macro.

    if (!GMOCK_FLAG(catch_leaked_mocks))
      return;

    int leaked_count = 0;
    for (StateMap::const_iterator it = states_.begin(); it != states_.end();
         ++it) {
      if (it->second.leakable)  // The user said it's fine to leak this object.
        continue;

      // TODO(wan@google.com): Print the type of the leaked object.
      // This can help the user identify the leaked object.
      std::cout << "\n";
      const MockObjectState& state = it->second;
      std::cout << internal::FormatFileLocation(state.first_used_file,
                                                state.first_used_line);
      std::cout << " ERROR: this mock object";
      if (state.first_used_test != "") {
        std::cout << " (used in test " << state.first_used_test_case << "."
             << state.first_used_test << ")";
      }
      std::cout << " should be deleted but never is. Its address is @"
           << it->first << ".";
      leaked_count++;
    }
    if (leaked_count > 0) {
      std::cout << "\nERROR: " << leaked_count
           << " leaked mock " << (leaked_count == 1 ? "object" : "objects")
           << " found at program exit.\n";
      std::cout.flush();
      ::std::cerr.flush();
      // RUN_ALL_TESTS() has already returned when this destructor is
      // called.  Therefore we cannot use the normal Google Test
      // failure reporting mechanism.
      _exit(1);  // We cannot call exit() as it is not reentrant and
                 // may already have been called.
    }
  }